

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O3

void __thiscall OpenMD::EAM::calcFunctional(EAM *this,SelfData *sdat)

{
  double dVar1;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  CubicSpline::getValueAndDerivativeAt
            ((this->EAMdata).
             super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl.
             super__Vector_impl_data._M_start
             [(this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[sdat->atid]].F.
             super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&sdat->rho,
             &sdat->frho,&sdat->dfrhodrho);
  dVar1 = sdat->frho;
  (sdat->selfPot).data_[3] = (sdat->selfPot).data_[3] + dVar1;
  if (sdat->isSelected == true) {
    (sdat->selePot).data_[3] = (sdat->selePot).data_[3] + dVar1;
  }
  if (sdat->doParticlePot == true) {
    sdat->particlePot = dVar1 + sdat->particlePot;
  }
  return;
}

Assistant:

void EAM::calcFunctional(SelfData& sdat) {
    if (!initialized_) initialize();
    EAMAtomData& data1 = EAMdata[EAMtids[sdat.atid]];

    data1.F->getValueAndDerivativeAt(sdat.rho, sdat.frho, sdat.dfrhodrho);

    sdat.selfPot[METALLIC_EMBEDDING_FAMILY] += sdat.frho;

    if (sdat.isSelected) sdat.selePot[METALLIC_EMBEDDING_FAMILY] += sdat.frho;

    if (sdat.doParticlePot) sdat.particlePot += sdat.frho;

    return;
  }